

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O1

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *pvVar2;
  pointer ppcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  ostream *poVar8;
  size_type *psVar9;
  const_iterator pit;
  pointer ppcVar10;
  bool bVar11;
  string parameter;
  string local_220;
  cmGeneratorExpressionContext *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  GeneratorExpressionContent *local_1d8;
  string *local_1d0;
  string *local_1c8;
  uint local_1c0;
  uint local_1bc;
  cmGeneratorExpressionNode *local_1b8;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = context;
  local_1d0 = identifier;
  local_1c8 = __return_storage_ptr__;
  uVar4 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
  pit._M_current =
       (this->ParamChildren).
       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = this;
  local_1b8 = node;
  iVar5 = (*node->_vptr_cmGeneratorExpressionNode[4])(node);
  local_1b0 = pvVar2;
  if (pit._M_current != pvVar2) {
    uVar6 = 1;
    local_1c0 = uVar4;
    do {
      local_1bc = uVar6;
      if ((uVar6 == local_1c0 & (byte)iVar5) == 1) {
        ProcessArbitraryContent
                  ((string *)local_1a8,local_1d8,local_1b8,local_1d0,local_200,dagChecker,pit);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
                   (string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_0038a4c5;
        goto LAB_0038a4d5;
      }
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      ppcVar3 = ((pit._M_current)->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_1a8._0_8_ = local_1a8 + 0x10;
      for (ppcVar10 = ((pit._M_current)->
                      super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                      )._M_impl.super__Vector_impl_data._M_start; bVar11 = ppcVar10 != ppcVar3,
          bVar11; ppcVar10 = ppcVar10 + 1) {
        (*(*ppcVar10)->_vptr_cmGeneratorExpressionEvaluator[3])
                  (&local_220,*ppcVar10,local_200,dagChecker);
        std::__cxx11::string::_M_append((char *)local_1a8,(ulong)local_220._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if (local_200->HadError == true) {
          (local_1c8->_M_dataplus)._M_p = (pointer)&local_1c8->field_2;
          local_1c8->_M_string_length = 0;
          (local_1c8->field_2)._M_local_buf[0] = '\0';
          if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
            return local_1c8;
          }
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          return local_1c8;
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      if (bVar11) {
        return local_1c8;
      }
      pit._M_current = pit._M_current + 1;
      uVar6 = local_1bc + 1;
      uVar4 = local_1c0;
    } while (pit._M_current != local_1b0);
  }
  if (((int)uVar4 < 1) ||
     ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)uVar4)) {
    if (uVar4 == 0xfffffffc) {
      if ((ulong)((long)(parameters->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_0038a4d5;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d8->StartContent,
                 local_1d8->StartContent + local_1d8->ContentLength);
      std::operator+(&local_1f8,"$<",local_1d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220.field_2._8_8_ = plVar7[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_220._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      reportError(local_200,(string *)local_1a8,&local_220);
    }
    else if (uVar4 == 0xfffffffe) {
      if (0x20 < (ulong)((long)(parameters->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(parameters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)) goto LAB_0038a4d5;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d8->StartContent,
                 local_1d8->StartContent + local_1d8->ContentLength);
      std::operator+(&local_1f8,"$<",local_1d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220.field_2._8_8_ = plVar7[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_220._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      reportError(local_200,(string *)local_1a8,&local_220);
    }
    else {
      if ((uVar4 != 0xffffffff) ||
         ((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0038a4d5;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,local_1d8->StartContent,
                 local_1d8->StartContent + local_1d8->ContentLength);
      std::operator+(&local_1f8,"$<",local_1d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220.field_2._8_8_ = plVar7[3];
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_220._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      reportError(local_200,(string *)local_1a8,&local_220);
    }
  }
  else {
    if (uVar4 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator+(&local_1f8,"$<",local_1d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      paVar1 = &local_220.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220.field_2._8_8_ = plVar7[3];
        local_220._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_220._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," comma separated parameters, but got ",0x25);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," instead.",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar1) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      local_220._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_220,local_1d8->StartContent,
                 local_1d8->StartContent + local_1d8->ContentLength);
      std::__cxx11::stringbuf::str();
      reportError(local_200,&local_220,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar1) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_0038a4d5;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,local_1d8->StartContent,
               local_1d8->StartContent + local_1d8->ContentLength);
    std::operator+(&local_1f8,"$<",local_1d0);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_220.field_2._M_allocated_capacity = *psVar9;
      local_220.field_2._8_8_ = plVar7[3];
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar9;
      local_220._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_220._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    reportError(local_200,(string *)local_1a8,&local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_0038a4c5:
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
LAB_0038a4d5:
  (local_1c8->_M_dataplus)._M_p = (pointer)&local_1c8->field_2;
  local_1c8->_M_string_length = 0;
  (local_1c8->field_2)._M_local_buf[0] = '\0';
  return local_1c8;
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    std::vector<std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator
      pit = this->ParamChildren.begin();
    const std::vector<
      std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator pend =
      this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        parameters.push_back(this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit));
        return std::string();
      }
      std::string parameter;
      for (cmGeneratorExpressionEvaluator* pExprEval : *pit) {
        parameter += pExprEval->Evaluate(context, dagChecker);
        if (context->HadError) {
          return std::string();
        }
      }
      parameters.push_back(std::move(parameter));
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       static_cast<unsigned int>(numExpected) != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least one parameter.");
  } else if (numExpected == cmGeneratorExpressionNode::TwoOrMoreParameters &&
             parameters.size() < 2) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least two parameters.");
  } else if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
             parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}